

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O1

string * __thiscall
helics::generateInterfaceQueryResults
          (string *__return_storage_ptr__,helics *this,string_view request,InterfaceInfo *info,
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          *addHeaderInfo)

{
  shared_mutex *psVar1;
  value_t vVar2;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  bVar3;
  json_value jVar4;
  pointer puVar5;
  EndpointInfo *pEVar6;
  pointer puVar7;
  PublicationInfo *pPVar8;
  pointer puVar9;
  InputInfo *pIVar10;
  _Alloc_hider _Var11;
  int iVar12;
  reference pvVar13;
  ulong uVar14;
  InterfaceInfo *this_00;
  void *__s1;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *ele;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  string_t *this_01;
  size_type __rlen;
  json V;
  json ipt;
  json base_2;
  json base;
  pthread_rwlock_t *local_e0;
  data local_d8;
  string *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string_t local_a0;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  data local_50;
  data local_40;
  
  this_00 = (InterfaceInfo *)request._M_str;
  __s1 = (void *)request._M_len;
  switch(this + -6) {
  case (helics *)0x0:
switchD_00383655_caseD_0:
    iVar12 = bcmp(__s1,"inputs",(size_t)this);
    if (iVar12 != 0) {
      switch(this) {
      case (helics *)0x9:
        goto switchD_00383655_caseD_3;
      default:
        goto switchD_00383655_caseD_1;
      case (helics *)0xd:
        goto switchD_00383655_caseD_7;
      case (helics *)0x10:
        goto switchD_00383655_caseD_a;
      case (helics *)0x11:
        goto switchD_00383655_caseD_b;
      case (helics *)0x13:
        goto switchD_00383655_caseD_d;
      }
    }
    local_e0 = (pthread_rwlock_t *)&(this_00->inputs).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_e0->__data);
    local_c8 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    puVar16 = (this_00->inputs).m_obj.dataStorage.
              super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (this_00->inputs).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar9) {
      do {
        if ((((puVar16->_M_t).
              super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>._M_t
              .super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
              super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->key)._M_string_length
            != 0) {
          pIVar10 = (puVar16->_M_t).
                    super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                    .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
          _Var11._M_p = (pIVar10->key)._M_dataplus._M_p;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,_Var11._M_p,_Var11._M_p + (pIVar10->key)._M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_d8,&local_c0);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_a0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_d8,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_d8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    (char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
              &local_a0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar9);
    }
    uVar14 = __return_storage_ptr__->_M_string_length;
    if (uVar14 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      goto LAB_00384125;
    }
    goto LAB_0038410d;
  default:
    goto switchD_00383655_caseD_1;
  case (helics *)0x3:
switchD_00383655_caseD_3:
    iVar12 = bcmp(__s1,"endpoints",(size_t)this);
    if (iVar12 != 0) {
      switch(this) {
      case (helics *)0xd:
        goto switchD_00383655_caseD_7;
      default:
        goto switchD_00383655_caseD_1;
      case (helics *)0x10:
        goto switchD_00383655_caseD_a;
      case (helics *)0x11:
        goto switchD_00383655_caseD_b;
      case (helics *)0x13:
        goto switchD_00383655_caseD_d;
      }
    }
    local_e0 = (pthread_rwlock_t *)&(this_00->endpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_e0->__data);
    local_c8 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    puVar15 = (this_00->endpoints).m_obj.dataStorage.
              super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this_00->endpoints).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar5) {
      do {
        if ((((puVar15->_M_t).
              super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
              .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->key).
            _M_string_length != 0) {
          pEVar6 = (puVar15->_M_t).
                   super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                   .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl;
          _Var11._M_p = (pEVar6->key)._M_dataplus._M_p;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,_Var11._M_p,_Var11._M_p + (pEVar6->key)._M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_d8,&local_c0);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_a0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_d8,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_d8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    (char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
              &local_a0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar5);
    }
    uVar14 = __return_storage_ptr__->_M_string_length;
    if (uVar14 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      goto LAB_00384125;
    }
LAB_0038410d:
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar14 - 1] = ']';
LAB_00384125:
    pthread_rwlock_unlock(local_e0);
    return __return_storage_ptr__;
  case (helics *)0x6:
    iVar12 = bcmp(__s1,"publications",(size_t)this);
    if (iVar12 != 0) {
      switch(this + -6) {
      case (helics *)0x0:
        goto switchD_00383655_caseD_0;
      default:
        goto switchD_00383655_caseD_1;
      case (helics *)0x3:
        goto switchD_00383655_caseD_3;
      case (helics *)0x7:
        goto switchD_00383655_caseD_7;
      case (helics *)0xa:
        goto switchD_00383655_caseD_a;
      case (helics *)0xb:
        goto switchD_00383655_caseD_b;
      case (helics *)0xd:
        goto switchD_00383655_caseD_d;
      }
    }
    local_e0 = (pthread_rwlock_t *)&(this_00->publications).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_e0->__data);
    local_c8 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    puVar17 = (this_00->publications).m_obj.dataStorage.
              super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this_00->publications).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar17 != puVar7) {
      do {
        if ((((puVar17->_M_t).
              super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
              .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl)->key).
            _M_string_length != 0) {
          pPVar8 = (puVar17->_M_t).
                   super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
                   .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
          _Var11._M_p = (pPVar8->key)._M_dataplus._M_p;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,_Var11._M_p,_Var11._M_p + (pPVar8->key)._M_string_length);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_d8,&local_c0);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_a0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_d8,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_d8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    (char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
              &local_a0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar7);
    }
    uVar14 = __return_storage_ptr__->_M_string_length;
    if (uVar14 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      goto LAB_00384125;
    }
    goto LAB_0038410d;
  case (helics *)0x7:
switchD_00383655_caseD_7:
    iVar12 = bcmp(__s1,"input_details",(size_t)this);
    if (iVar12 == 0) {
      local_70._M_local_buf[0] = '\0';
      local_70._8_8_ = 0;
      if ((info->publications).m_obj.dataStorage.
          super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)(info->publications).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(info);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)(local_80 + 0x10),"inputs");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_40.m_type;
      jVar4 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar2;
      local_40.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      psVar1 = &(this_00->inputs).m_mutex;
      std::__shared_mutex_pthread::lock_shared(&psVar1->_M_impl);
      puVar16 = (this_00->inputs).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this_00->inputs).m_obj.dataStorage.
               super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar16 != puVar9) {
        do {
          pIVar10 = (puVar16->_M_t).
                    super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                    .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
          if ((pIVar10->key)._M_string_length != 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a0,(initializer_list_t)ZEXT816(0),false,object);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pIVar10->key);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"name");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = (value_t)local_c0._M_dataplus._M_p;
            local_c0._M_dataplus._M_p._0_1_ = vVar2;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = (json_value)local_c0._M_string_length;
            local_c0._M_string_length = (size_type)jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pIVar10->units);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"units");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = local_d8.m_type;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = local_d8.m_value;
            local_d8.m_type = vVar2;
            local_d8.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_d8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pIVar10->type);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"type");
            bVar3 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )(pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = (value_t)local_80[0];
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = (json_value)local_80._8_8_;
            local_80[0] = bVar3;
            local_80._8_8_ = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)local_80);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)(local_80 + 0x10),"inputs");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_a0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_a0);
          }
          puVar16 = puVar16 + 1;
        } while (puVar16 != puVar9);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)psVar1);
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_80 + 0x10),true);
      goto LAB_00383d78;
    }
    if (this == (helics *)&DAT_00000010) goto switchD_00383655_caseD_a;
    if (this != (helics *)0x11) {
      if (this != (helics *)0x13) goto switchD_00383655_caseD_1;
      goto switchD_00383655_caseD_d;
    }
    break;
  case (helics *)0xa:
switchD_00383655_caseD_a:
    iVar12 = bcmp(__s1,"endpoint_details",(size_t)this);
    if (iVar12 == 0) {
      local_80[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x0;
      local_80._8_8_ = (object_t *)0x0;
      if ((info->publications).m_obj.dataStorage.
          super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)(info->publications).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(info);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,(initializer_list_t)ZEXT816(0),false,array);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_80,"endpoints");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_60._M_local_buf[0];
      jVar4 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = (json_value)local_60._8_8_;
      local_c8 = __return_storage_ptr__;
      local_60._M_local_buf[0] = vVar2;
      local_60._8_8_ = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_60);
      psVar1 = &(this_00->endpoints).m_mutex;
      std::__shared_mutex_pthread::lock_shared(&psVar1->_M_impl);
      puVar15 = (this_00->endpoints).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (this_00->endpoints).m_obj.dataStorage.
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar15 != puVar5) {
        do {
          pEVar6 = (puVar15->_M_t).
                   super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                   .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl;
          if ((pEVar6->key)._M_string_length != 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a0,(initializer_list_t)ZEXT816(0),false,object);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar6->key);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"name");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = (value_t)local_c0._M_dataplus._M_p;
            local_c0._M_dataplus._M_p._0_1_ = vVar2;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = (json_value)local_c0._M_string_length;
            local_c0._M_string_length = (size_type)jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar6->type);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"type");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = local_d8.m_type;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = local_d8.m_value;
            local_d8.m_type = vVar2;
            local_d8.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_d8);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)local_80,"endpoints");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_a0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_a0);
          }
          puVar15 = puVar15 + 1;
        } while (puVar15 != puVar5);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)psVar1);
      __return_storage_ptr__ = local_c8;
      fileops::generateJsonString(local_c8,(json *)local_80,true);
      this_01 = (string_t *)local_80;
      goto LAB_00383d7d;
    }
    if (this != (helics *)0x11) goto switchD_00383655_caseD_1;
    break;
  case (helics *)0xb:
    break;
  case (helics *)0xd:
switchD_00383655_caseD_d:
    iVar12 = bcmp(__s1,"publication_details",(size_t)this);
    if (iVar12 == 0) {
      local_70._M_local_buf[0] = '\0';
      local_70._8_8_ = 0;
      if ((info->publications).m_obj.dataStorage.
          super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)(info->publications).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(info);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_50,(initializer_list_t)ZEXT816(0),false,array);
      pvVar13 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)(local_80 + 0x10),"publications");
      vVar2 = (pvVar13->m_data).m_type;
      (pvVar13->m_data).m_type = local_50.m_type;
      jVar4 = (pvVar13->m_data).m_value;
      (pvVar13->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar2;
      local_50.m_value = jVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      psVar1 = &(this_00->publications).m_mutex;
      std::__shared_mutex_pthread::lock_shared(&psVar1->_M_impl);
      puVar17 = (this_00->publications).m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = (this_00->publications).m_obj.dataStorage.
               super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar17 != puVar7) {
        do {
          pPVar8 = (puVar17->_M_t).
                   super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
                   .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
          if ((pPVar8->key)._M_string_length != 0) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a0,(initializer_list_t)ZEXT816(0),false,object);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pPVar8->key);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"name");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = (value_t)local_c0._M_dataplus._M_p;
            local_c0._M_dataplus._M_p._0_1_ = vVar2;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = (json_value)local_c0._M_string_length;
            local_c0._M_string_length = (size_type)jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pPVar8->units);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"units");
            vVar2 = (pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = local_d8.m_type;
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = local_d8.m_value;
            local_d8.m_type = vVar2;
            local_d8.m_value = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_d8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pPVar8->type);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&local_a0,"type");
            bVar3 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )(pvVar13->m_data).m_type;
            (pvVar13->m_data).m_type = (value_t)local_80[0];
            jVar4 = (pvVar13->m_data).m_value;
            (pvVar13->m_data).m_value = (json_value)local_80._8_8_;
            local_80[0] = bVar3;
            local_80._8_8_ = jVar4;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)local_80);
            pvVar13 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)(local_80 + 0x10),"publications");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar13,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_a0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_a0);
          }
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar7);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)psVar1);
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_80 + 0x10),true);
LAB_00383d78:
      this_01 = (string_t *)(local_80 + 0x10);
      goto LAB_00383d7d;
    }
    if (this != (helics *)0x11) {
      if (this != (helics *)&DAT_00000010) goto switchD_00383655_caseD_1;
      goto switchD_00383655_caseD_a;
    }
  }
switchD_00383655_caseD_b:
  iVar12 = bcmp(__s1,"interface_details",(size_t)this);
  if (iVar12 != 0) {
switchD_00383655_caseD_1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_a0._M_dataplus._M_p._0_1_ = 0;
  local_a0._M_string_length = 0;
  if ((info->publications).m_obj.dataStorage.
      super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    std::__throw_bad_function_call();
  }
  (*(code *)(info->publications).m_obj.dataStorage.
            super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)(info,&local_a0);
  InterfaceInfo::generateInferfaceConfig(this_00,(json *)&local_a0);
  fileops::generateJsonString(__return_storage_ptr__,(json *)&local_a0,true);
  this_01 = &local_a0;
LAB_00383d7d:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const InterfaceInfo& info,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "publications") {
        return generateStringVector_if(
            info.getPublications(),
            [](auto& pub) { return pub->key; },
            [](auto& pub) { return !pub->key.empty(); });
    }
    if (request == "inputs") {
        return generateStringVector_if(
            info.getInputs(),
            [](auto& inp) { return inp->key; },
            [](auto& inp) { return !inp->key.empty(); });
    }

    if (request == "endpoints") {
        return generateStringVector_if(
            info.getEndpoints(),
            [](auto& ept) { return ept->key; },
            [](auto& ept) { return !ept->key.empty(); });
    }

    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : info.getInputs()) {
            if (!handle->key.empty()) {
                storeInput(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : info.getPublications()) {
            if (!handle->key.empty()) {
                storePublication(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : info.getEndpoints()) {
            if (!handle->key.empty()) {
                storeEndpoint(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        info.generateInferfaceConfig(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}